

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall
InterpGCTest_Collect_GlobalCycle_Test::TestBody(InterpGCTest_Collect_GlobalCycle_Test *this)

{
  Store *store;
  ObjectList *this_00;
  undefined4 uVar1;
  undefined8 in_R8;
  char *pcVar2;
  undefined8 in_R9;
  Value value;
  Value value_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  Index after_new;
  Ptr g1;
  Ptr g2;
  undefined **local_60;
  undefined4 local_58;
  undefined8 local_54;
  undefined **local_48;
  undefined4 local_40;
  undefined8 local_3c;
  
  store = &(this->super_InterpGCTest).super_InterpTest.store_;
  uVar1._0_1_ = true;
  uVar1._1_1_ = false;
  uVar1._2_1_ = false;
  uVar1._3_1_ = false;
  local_48 = &PTR__ExternType_002e7c00;
  local_3c = 0x1ffffffef;
  value._8_8_ = in_R9;
  value.i64_ = in_R8;
  local_40 = uVar1;
  wabt::interp::Global::New(&g1,(Global *)store,(Store *)&local_48,(GlobalType *)0x0,value);
  local_60 = &PTR__ExternType_002e7c00;
  local_54 = 0x1ffffffef;
  value_00._8_8_ = in_R9;
  value_00.i64_ = in_R8;
  local_58 = uVar1;
  wabt::interp::Global::New
            (&g2,(Global *)store,(Store *)&local_60,
             (GlobalType *)((g1.obj_)->super_Extern).super_Object.self_.index,value_00);
  wabt::interp::Global::Set(g1.obj_,store,(Ref)((g2.obj_)->super_Extern).super_Object.self_.index);
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_.objects_;
  after_new = wabt::interp::
              FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
              ::count(this_00);
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"before_new + 2","after_new",(unsigned_long *)&local_b8,
             &after_new);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::interp::RefPtr<wabt::interp::Global>::reset(&g1);
  wabt::interp::Store::Collect(store);
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::interp::
       FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
       ::count(this_00);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"after_new","store_.object_count()",&after_new,
             (unsigned_long *)&local_b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::interp::RefPtr<wabt::interp::Global>::reset(&g2);
  wabt::interp::RefPtr<wabt::interp::Global>::reset(&g2);
  wabt::interp::RefPtr<wabt::interp::Global>::reset(&g1);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_GlobalCycle) {
  auto gt = GlobalType{ValueType::Anyref, Mutability::Var};
  auto g1 = Global::New(store_, gt, Value::Make(Ref::Null));
  auto g2 = Global::New(store_, gt, Value::Make(g1->self()));
  g1->Set(store_, g2->self());

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 2, after_new);

  // Remove g1 root, but it's kept alive by g2.
  g1.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove g2 root, now both should be removed.
  g2.reset();
}